

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_TextureMapping::TileTextureCoordinate(ON_TextureMapping *this,int dir,double count,double offset)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  ON_Xform *pOVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  ON_Xform x;
  ON_Xform local_a0;
  
  bVar6 = 0;
  bVar1 = false;
  if (((uint)dir < 4) && ((count != 0.0 || (bVar1 = false, NAN(count))))) {
    bVar1 = ON_IsValid(count);
    if ((bVar1) && (bVar1 = ON_IsValid(offset), bVar1)) {
      lVar3 = 0x10;
      pOVar4 = &ON_Xform::IdentityTransformation;
      pOVar5 = &x;
      for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
        pOVar5->m_xform[0][0] = pOVar4->m_xform[0][0];
        pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pOVar5 = (ON_Xform *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      *(double *)((long)x.m_xform + (ulong)(uint)dir * 0x28) = count;
      x.m_xform[(uint)dir][3] = offset;
      ON_Xform::operator*(&local_a0,&x,&this->m_uvw);
      pOVar4 = &local_a0;
      pOVar5 = &this->m_uvw;
      for (; lVar3 != 0; lVar3 = lVar3 + -1) {
        pOVar5->m_xform[0][0] = pOVar4->m_xform[0][0];
        pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
        pOVar5 = (ON_Xform *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ON_TextureMapping::TileTextureCoordinate( int dir, double count, double offset )
{
  bool rc = false;
  if ( 0 <= dir && dir <= 3 && 0.0 != count && ON_IsValid(count) && ON_IsValid(offset) )
  {
    ON_Xform x(ON_Xform::IdentityTransformation);
    x.m_xform[dir][dir] = count;
    x.m_xform[dir][3] = offset;
    m_uvw = x*m_uvw;
    rc = true;
  }
  return rc;
}